

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

size_t __thiscall helics::Input::getStringSize(Input *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  NamedPoint *pNVar4;
  int __c;
  int __c_00;
  char *in_RSI;
  Input *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  NamedPoint *np_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_1;
  NamedPoint *np;
  Input *in_stack_000000c0;
  Input *in_stack_000000d0;
  size_type local_8;
  
  isUpdated(in_RDI);
  bVar1 = allowDirectFederateUpdate(in_RDI);
  if (bVar1) {
    pcVar2 = CLI::std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index(&in_RDI->lastValue,in_RSI,__c);
    if (pcVar2 == (char *)0x6) {
      pNVar4 = getValueRef<helics::NamedPoint>(in_stack_000000d0);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a481);
      if (bVar1) {
        local_8 = 0x1e;
      }
      else {
        local_8 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                            (&pNVar4->name);
        local_8 = local_8 + 0x14;
      }
    }
    else {
      pbVar3 = getValueRef<std::__cxx11::string>(in_stack_000000c0);
      local_8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(pbVar3);
    }
  }
  else {
    pcVar2 = CLI::std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index(&in_RDI->lastValue,in_RSI,__c);
    if (pcVar2 == (char *)0x2) {
      pbVar3 = std::
               get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)0x36a4ef);
      local_8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(pbVar3);
    }
    else {
      pcVar2 = CLI::std::
               variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
               ::index(&in_RDI->lastValue,in_RSI,__c_00);
      if (pcVar2 == (char *)0x6) {
        pNVar4 = std::
                 get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                           ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                             *)0x36a51e);
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x36a52d);
        if (bVar1) {
          local_8 = 0x1e;
        }
        else {
          local_8 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                              (&pNVar4->name);
          local_8 = local_8 + 0x14;
        }
      }
      else {
        pbVar3 = getValueRef<std::__cxx11::string>(in_stack_000000c0);
        local_8 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(pbVar3);
      }
    }
  }
  return local_8;
}

Assistant:

size_t Input::getStringSize()
{
    isUpdated();
    if (allowDirectFederateUpdate()) {
        if (lastValue.index() == named_point_loc) {
            const auto& np = getValueRef<NamedPoint>();
            if (np.name.empty()) {
                return 30;  //"#invalid" string +20
            }
            // +20 is just in case the converted string is actually being requested in which case
            // the +20 is for the string representation of a double
            return np.name.size() + 20;
        }
        const auto& out = getValueRef<std::string>();
        return out.size();
    }

    if (lastValue.index() == string_loc) {
        return std::get<std::string>(lastValue).size();
    }
    if (lastValue.index() == named_point_loc) {
        const auto& np = std::get<NamedPoint>(lastValue);

        if (np.name.empty()) {
            return 30;  //"~length of #invalid" string +20
        }
        // +20 is just in case the converted string is actually being requested in which case the
        // +20 accounts for the string representation of a double
        return np.name.size() + 20;
    }
    const auto& out = getValueRef<std::string>();
    return out.size();
}